

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

int __thiscall File::rename(File *this,char *__old,char *__new)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  undefined8 unaff_R15;
  
  if ((int)__new == 0) {
    pcVar2 = String::operator_cast_to_char_((String *)this);
    pcVar3 = String::operator_cast_to_char_((String *)__old);
    iVar1 = ::rename(pcVar2,pcVar3);
    iVar1 = (int)CONCAT71((int7)((ulong)unaff_R15 >> 8),iVar1 == 0);
  }
  else {
    pcVar2 = String::operator_cast_to_char_((String *)__old);
    iVar1 = 0;
    __fd = ::open(pcVar2,0x800c0,0x1a4);
    if (__fd != -1) {
      pcVar2 = String::operator_cast_to_char_((String *)this);
      pcVar3 = String::operator_cast_to_char_((String *)__old);
      iVar1 = ::rename(pcVar2,pcVar3);
      if (iVar1 == 0) {
        ::close(__fd);
        iVar1 = 1;
      }
      else {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        ::close(__fd);
        *piVar4 = iVar1;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

bool File::rename(const String& from, const String& to, bool failIfExists)
{
#ifdef _WIN32
  return MoveFileEx(from, to, MOVEFILE_COPY_ALLOWED | (failIfExists ? 0 : MOVEFILE_REPLACE_EXISTING)) == TRUE;
#else
  if(failIfExists)
  {
    int fd = ::open(to, O_CREAT | O_EXCL | O_CLOEXEC, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
    if(fd == -1)
      return false;
    if(::rename(from, to) != 0)
    {
      int err = errno;
      ::close(fd);
      errno = err;
      return false;
    }
    ::close(fd);
    return true;
  }
  else
    return ::rename(from, to) == 0;
#endif
}